

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_long,4ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_4UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_4UL>_>_>_>
          *result)

{
  bool bVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char c;
  array<unsigned_long,_4UL> value;
  char local_79;
  undefined1 local_78 [20];
  undefined4 uStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  array<unsigned_long,_4UL> local_50;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
    local_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    stack0xffffffffffffff98 = 0;
    local_60 = 0;
    uStack_58 = 0;
  }
  else {
    bVar1 = ParseBasicTypeTuple<unsigned_long,4ul>(this,&local_50);
    if (!bVar1) {
      pcVar5 = "Not starting with the tuple value of requested type.\n";
      pcVar4 = "";
      goto LAB_003afcd4;
    }
    local_78[0] = 1;
    local_78._12_4_ = local_50._M_elems[0]._4_4_;
    local_78._8_4_ = (undefined4)local_50._M_elems[0];
    unique0x10000357 = CONCAT44(local_50._M_elems[1]._4_4_,(undefined4)local_50._M_elems[1]);
    local_60 = local_50._M_elems[2];
    uStack_58 = local_50._M_elems[3];
  }
  ::std::
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
  ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
            ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
              *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
  pSVar2 = this->_sr;
  uVar3 = pSVar2->idx_;
  if (uVar3 < pSVar2->length_) {
    while (pSVar2->binary_[uVar3] != '\0') {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_79);
      if (!bVar1) {
        return false;
      }
      if (local_79 != sep) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar3 = pSVar2->idx_ - 1, uVar3 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar3;
        }
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
        local_60 = 0;
        uStack_58 = 0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        local_78._16_4_ = 0;
        uStack_64 = 0;
      }
      else {
        bVar1 = ParseBasicTypeTuple<unsigned_long,4ul>(this,&local_50);
        if (!bVar1) break;
        local_78[0] = 1;
        local_60 = local_50._M_elems[2];
        uStack_58 = local_50._M_elems[3];
        local_78._8_4_ = (undefined4)local_50._M_elems[0];
        local_78._12_4_ = local_50._M_elems[0]._4_4_;
        local_78._16_4_ = (undefined4)local_50._M_elems[1];
        uStack_64 = local_50._M_elems[1]._4_4_;
      }
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,4ul>>>>
                  *)result,(optional<std::array<unsigned_long,_4UL>_> *)local_78);
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (pSVar2->length_ <= uVar3) break;
    }
  }
  if (*(long *)result != *(long *)(result + 8)) {
    return true;
  }
  pcVar5 = "Empty array.\n";
  pcVar4 = "";
LAB_003afcd4:
  local_78._0_8_ = local_78 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar5,pcVar4);
  PushError(this,(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,stack0xffffffffffffff98 + 1);
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}